

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

CURLcode proxy_h2_progress_ingress(Curl_cfilter *cf,Curl_easy *data)

{
  bufq *q;
  void *pvVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  CURLcode result;
  CURLcode local_3c;
  bufq *local_38;
  
  pvVar1 = cf->ctx;
  local_3c = CURLE_OK;
  q = (bufq *)((long)pvVar1 + 0x10);
  _Var2 = Curl_bufq_is_empty(q);
  if (!_Var2) {
    if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
      sVar4 = Curl_bufq_len(q);
      Curl_trc_cf_infof(data,cf,"[0] process %zu bytes in connection buffer",sVar4);
    }
    iVar3 = proxy_h2_process_pending_input(cf,data,&local_3c);
    if (iVar3 < 0) {
      return local_3c;
    }
  }
  local_38 = (bufq *)((long)pvVar1 + 0x98);
  do {
    if ((((*(byte *)((long)pvVar1 + 0x140) & 1) != 0) ||
        ((*(byte *)((long)pvVar1 + 0x134) & 2) != 0)) ||
       ((_Var2 = Curl_bufq_is_empty(q), !_Var2 || (_Var2 = Curl_bufq_is_full(local_38), _Var2)))) {
LAB_005facb2:
      if ((*(byte *)((long)pvVar1 + 0x140) & 1) == 0) {
        return CURLE_OK;
      }
      _Var2 = Curl_bufq_is_empty(q);
      if (!_Var2) {
        return CURLE_OK;
      }
      Curl_conncontrol(cf->conn,1);
      return CURLE_OK;
    }
    sVar5 = Curl_bufq_slurp(q,proxy_nw_in_reader,cf,&local_3c);
    if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
       (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
      sVar4 = Curl_bufq_len(q);
      Curl_trc_cf_infof(data,cf,"[0] read %zu bytes nw data -> %zd, %d",sVar4,sVar5,(ulong)local_3c)
      ;
    }
    if (sVar5 < 0) {
      if (local_3c != CURLE_AGAIN) {
        Curl_failf(data,"Failed receiving HTTP2 data");
        return local_3c;
      }
      goto LAB_005facb2;
    }
    if (sVar5 == 0) {
      *(byte *)((long)pvVar1 + 0x140) = *(byte *)((long)pvVar1 + 0x140) | 1;
      goto LAB_005facb2;
    }
    iVar3 = proxy_h2_process_pending_input(cf,data,&local_3c);
    if (iVar3 != 0) {
      return local_3c;
    }
  } while( true );
}

Assistant:

static CURLcode proxy_h2_progress_ingress(struct Curl_cfilter *cf,
                                          struct Curl_easy *data)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  ssize_t nread;

  /* Process network input buffer fist */
  if(!Curl_bufq_is_empty(&ctx->inbufq)) {
    CURL_TRC_CF(data, cf, "[0] process %zu bytes in connection buffer",
                Curl_bufq_len(&ctx->inbufq));
    if(proxy_h2_process_pending_input(cf, data, &result) < 0)
      return result;
  }

  /* Receive data from the "lower" filters, e.g. network until
   * it is time to stop or we have enough data for this stream */
  while(!ctx->conn_closed &&               /* not closed the connection */
        !ctx->tunnel.closed &&             /* nor the tunnel */
        Curl_bufq_is_empty(&ctx->inbufq) && /* and we consumed our input */
        !Curl_bufq_is_full(&ctx->tunnel.recvbuf)) {

    nread = Curl_bufq_slurp(&ctx->inbufq, proxy_nw_in_reader, cf, &result);
    CURL_TRC_CF(data, cf, "[0] read %zu bytes nw data -> %zd, %d",
                Curl_bufq_len(&ctx->inbufq), nread, result);
    if(nread < 0) {
      if(result != CURLE_AGAIN) {
        failf(data, "Failed receiving HTTP2 data");
        return result;
      }
      break;
    }
    else if(nread == 0) {
      ctx->conn_closed = TRUE;
      break;
    }

    if(proxy_h2_process_pending_input(cf, data, &result))
      return result;
  }

  if(ctx->conn_closed && Curl_bufq_is_empty(&ctx->inbufq)) {
    connclose(cf->conn, "GOAWAY received");
  }

  return CURLE_OK;
}